

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interp-wasm-c-api.cc
# Opt level: O3

void wasm_instance_exports(wasm_instance_t *instance,wasm_extern_vec_t *out)

{
  if (((instance->super_wasm_ref_t).I.obj_)->kind_ == Instance) {
    wasm_instance_exports_cold_1();
    return;
  }
  __assert_fail("isa<Derived>(base)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/asbish[P]wabt/src/cast.h",
                0x4e,
                "Derived *wabt::cast(Base *) [Derived = wabt::interp::Instance, Base = wabt::interp::Object]"
               );
}

Assistant:

void wasm_instance_exports(const wasm_instance_t* instance,
                           own wasm_extern_vec_t* out) {
  auto&& exports = instance->As<Instance>()->exports();
  wasm_extern_vec_new_uninitialized(out, exports.size());
  TRACE("%" PRIzx, exports.size());

  for (size_t i = 0; i < exports.size(); ++i) {
    out->data[i] =
        new wasm_extern_t{instance->I.store()->UnsafeGet<Extern>(exports[i])};
  }
}